

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O1

void nn_stcp_start(nn_stcp *self,nn_usock *usock)

{
  if ((self->usock == (nn_usock *)0x0) && ((self->usock_owner).fsm == (nn_fsm *)0x0)) {
    (self->usock_owner).src = 1;
    (self->usock_owner).fsm = &self->fsm;
    nn_usock_swap_owner(usock,&self->usock_owner);
    self->usock = usock;
    nn_fsm_start(&self->fsm);
    return;
  }
  nn_stcp_start_cold_1();
}

Assistant:

void nn_stcp_start (struct nn_stcp *self, struct nn_usock *usock)
{
    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_STCP_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}